

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitUseBeforeDeclaration(Symbol *sym,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  bool bVar1;
  Scope *pSVar2;
  Scope *target;
  FuncInfo *pFVar3;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  Symbol *sym_local;
  
  if (((sym != (Symbol *)0x0) && (bVar1 = Symbol::GetIsModuleExportStorage(sym), !bVar1)) &&
     (bVar1 = Symbol::GetNeedDeclaration(sym), bVar1)) {
    pSVar2 = ByteCodeGenerator::GetCurrentScope(byteCodeGenerator);
    target = Symbol::GetScope(sym);
    bVar1 = Scope::HasStaticPathToAncestor(pSVar2,target);
    if (bVar1) {
      pSVar2 = Symbol::GetScope(sym);
      pFVar3 = Scope::GetFunc(pSVar2);
      if (pFVar3 == funcInfo) {
        EmitUseBeforeDeclarationRuntimeError(byteCodeGenerator,0xffffffff);
      }
    }
  }
  return;
}

Assistant:

void EmitUseBeforeDeclaration(Symbol *sym, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    // Don't emit static use-before-declaration error in a closure or dynamic scope case. We detect such cases with dynamic checks,
    // if necessary.
    if (sym != nullptr &&
        !sym->GetIsModuleExportStorage() &&
        sym->GetNeedDeclaration() &&
        byteCodeGenerator->GetCurrentScope()->HasStaticPathToAncestor(sym->GetScope()) &&
        sym->GetScope()->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(byteCodeGenerator, Js::Constants::NoRegister);
    }
}